

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oalsound.cpp
# Opt level: O2

void I_BuildALDeviceList(FOptionValues *opt)

{
  TArray<FOptionValues::Pair,_FOptionValues::Pair>::Resize(&opt->mValues,1);
  FString::operator=(&((opt->mValues).Array)->TextValue,"Default");
  FString::operator=(&((opt->mValues).Array)->Text,"Default");
  return;
}

Assistant:

void I_BuildALDeviceList(FOptionValues *opt)
{
    opt->mValues.Resize(1);
    opt->mValues[0].TextValue = "Default";
    opt->mValues[0].Text = "Default";

#ifndef NO_OPENAL
	if (IsOpenALPresent())
	{
		const ALCchar *names = (alcIsExtensionPresent(NULL, "ALC_ENUMERATE_ALL_EXT") ?
			alcGetString(NULL, ALC_ALL_DEVICES_SPECIFIER) :
			alcGetString(NULL, ALC_DEVICE_SPECIFIER));
		if (!names)
			Printf("Failed to get device list: %s\n", alcGetString(NULL, alcGetError(NULL)));
		else while (*names)
		{
			unsigned int i = opt->mValues.Reserve(1);
			opt->mValues[i].TextValue = names;
			opt->mValues[i].Text = names;

			names += strlen(names) + 1;
		}
	}
#endif
}